

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O3

void stringcache_destroy(StringCache *cache)

{
  StringBucket *pSVar1;
  uint uVar2;
  StringBucket *__ptr;
  ulong uVar3;
  
  if (cache != (StringCache *)0x0) {
    uVar2 = cache->table_size;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        __ptr = cache->hashtable[uVar3];
        cache->hashtable[uVar3] = (StringBucket *)0x0;
        if (__ptr != (StringBucket *)0x0) {
          do {
            pSVar1 = __ptr->next;
            free(__ptr);
            __ptr = pSVar1;
          } while (pSVar1 != (StringBucket *)0x0);
          uVar2 = cache->table_size;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2);
    }
    free(cache->hashtable);
    free(cache);
    return;
  }
  return;
}

Assistant:

void stringcache_destroy(StringCache *cache)
{
    size_t i;

    if (cache == NULL)
        return;

    for (i = 0; i < cache->table_size; i++)
    {
        StringBucket *bucket = cache->hashtable[i];
        cache->hashtable[i] = NULL;
        while (bucket)
        {
            StringBucket *next = bucket->next;
            free(bucket);
            bucket = next;
        } // while
    } // for

    free(cache->hashtable);
    free(cache);
}